

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void compareTwoVectorsWithAssert
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v1,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v2)

{
  bool bVar1;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar1 = std::operator==(v1,v2);
  if (bVar1) {
    return;
  }
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_c_cmakelists/dtysky[P]Algorithm/utils.h",0x39,
                "void compareTwoVectorsWithAssert(std::vector<uint32_t> &, std::vector<uint32_t> &)"
               );
}

Assistant:

void compareTwoVectorsWithAssert(std::vector<uint32_t >& v1, std::vector<uint32_t >& v2) {
    std::cout << std::endl;
    assert(v1 == v2);
}